

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_bt3_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint8_t *puVar1;
  uint32_t *puVar2;
  lzma_match *plVar3;
  uint uVar4;
  uint32_t pos;
  uint len_limit;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint32_t len_best;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  bool bVar11;
  
  uVar9 = mf->read_pos;
  uVar4 = mf->write_pos - uVar9;
  len_limit = mf->nice_len;
  if ((uVar4 < mf->nice_len) && ((uVar4 < 3 || (len_limit = uVar4, mf->action == LZMA_SYNC_FLUSH))))
  {
    if (mf->action != LZMA_RUN) {
      move_pending(mf);
      return 0;
    }
    __assert_fail("mf->action != LZMA_RUN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                  ,0x2a8,"uint32_t lzma_mf_bt3_find(lzma_mf *, lzma_match *)");
  }
  puVar1 = mf->buffer;
  puVar2 = mf->hash;
  pos = mf->offset + uVar9;
  uVar6 = (uint)puVar1[(ulong)uVar9 + 1] ^ lzma_crc32_table[0][puVar1[uVar9]];
  uVar7 = uVar6 & 0x3ff;
  uVar4 = pos - puVar2[uVar7];
  cur = puVar1 + uVar9;
  uVar9 = (((uint)puVar1[(ulong)uVar9 + 2] << 8 ^ uVar6) & mf->hash_mask) + 0x400;
  uVar10 = puVar2[uVar9];
  puVar2[uVar7] = pos;
  puVar2[uVar9] = pos;
  uVar9 = mf->cyclic_size;
  len_best = 2;
  if ((uVar4 < uVar9) && (cur[-(ulong)uVar4] == *cur)) {
    bVar11 = len_limit == 2;
    uVar8 = 2;
    if (bVar11) {
LAB_00475e97:
      matches->len = uVar8;
      matches->dist = uVar4 - 1;
    }
    else {
      lVar5 = -(ulong)uVar4;
      len_best = 2;
      if (cur[lVar5 + 2] == cur[2]) {
        uVar6 = 3;
        do {
          len_best = uVar6;
          bVar11 = len_limit == len_best;
          uVar8 = len_limit;
          if (bVar11) goto LAB_00475e97;
          uVar6 = len_best + 1;
        } while (cur[lVar5 + (ulong)len_best] == cur[len_best]);
      }
      matches->len = len_best;
      matches->dist = uVar4 - 1;
      lVar5 = 1;
      if (!bVar11) goto LAB_00475e60;
    }
    bt_skip_func(len_limit,pos,cur,uVar10,mf->depth,mf->son,mf->cyclic_pos,uVar9);
    move_pos(mf);
    uVar10 = 1;
  }
  else {
    lVar5 = 0;
LAB_00475e60:
    plVar3 = bt_find_func(len_limit,pos,cur,uVar10,mf->depth,mf->son,mf->cyclic_pos,uVar9,
                          matches + lVar5,len_best);
    uVar10 = (uint32_t)((ulong)((long)plVar3 - (long)matches) >> 3);
    move_pos(mf);
  }
  return uVar10;
}

Assistant:

extern uint32_t
lzma_mf_bt3_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value; /* hash_3_calc */
	uint32_t delta2, cur_match;
	uint32_t len_best = 2;
	uint32_t matches_count = 0;

	header_find(true, 3);

	hash_3_calc();

	delta2 = pos - mf->hash[hash_2_value];
	cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[0].len = len_best;
		matches[0].dist = delta2 - 1;
		matches_count = 1;

		if (len_best == len_limit) {
			bt_skip();
			return 1; // matches_count
		}
	}

	bt_find(len_best);
}